

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_2::VBox::ComputeRequirement(VBox *this)

{
  int *piVar1;
  Selection SVar2;
  int iVar3;
  pointer psVar4;
  element_type *peVar5;
  int iVar6;
  int iVar7;
  shared_ptr<ftxui::Node> *child;
  pointer psVar8;
  
  (this->super_Node).requirement_.flex_grow_y = 0;
  (this->super_Node).requirement_.flex_shrink_x = 0;
  (this->super_Node).requirement_.flex_shrink_y = 0;
  (this->super_Node).requirement_.selection = NORMAL;
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  (this->super_Node).requirement_.flex_grow_x = 0;
  (this->super_Node).requirement_.flex_grow_y = 0;
  psVar8 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar4) {
    do {
      (*((psVar8->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Node
        [2])();
      peVar5 = (psVar8->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      SVar2 = (peVar5->requirement_).selection;
      if ((int)(this->super_Node).requirement_.selection < (int)SVar2) {
        (this->super_Node).requirement_.selection = SVar2;
        iVar7 = (peVar5->requirement_).selected_box.x_max;
        iVar3 = (peVar5->requirement_).selected_box.y_min;
        iVar6 = (peVar5->requirement_).selected_box.y_max;
        (this->super_Node).requirement_.selected_box.x_min =
             (peVar5->requirement_).selected_box.x_min;
        (this->super_Node).requirement_.selected_box.x_max = iVar7;
        (this->super_Node).requirement_.selected_box.y_min = iVar3;
        (this->super_Node).requirement_.selected_box.y_max = iVar6;
        iVar7 = (this->super_Node).requirement_.min_y;
        piVar1 = &(this->super_Node).requirement_.selected_box.y_min;
        *piVar1 = *piVar1 + iVar7;
        piVar1 = &(this->super_Node).requirement_.selected_box.y_max;
        *piVar1 = *piVar1 + iVar7;
      }
      peVar5 = (psVar8->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      piVar1 = &(this->super_Node).requirement_.min_y;
      *piVar1 = *piVar1 + (peVar5->requirement_).min_y;
      iVar7 = (peVar5->requirement_).min_x;
      iVar3 = (this->super_Node).requirement_.min_x;
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      (this->super_Node).requirement_.min_x = iVar7;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar4);
  }
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    requirement_.flex_grow_x = 0;
    requirement_.flex_grow_y = 0;
    requirement_.flex_shrink_x = 0;
    requirement_.flex_shrink_y = 0;
    requirement_.selection = Requirement::NORMAL;
    for (auto& child : children_) {
      child->ComputeRequirement();
      if (requirement_.selection < child->requirement().selection) {
        requirement_.selection = child->requirement().selection;
        requirement_.selected_box = child->requirement().selected_box;
        requirement_.selected_box.y_min += requirement_.min_y;
        requirement_.selected_box.y_max += requirement_.min_y;
      }
      requirement_.min_y += child->requirement().min_y;
      requirement_.min_x =
          std::max(requirement_.min_x, child->requirement().min_x);
    }
  }